

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O3

string * __thiscall cmMakefile::GetRequiredDefinition(cmMakefile *this,string *name)

{
  string *psVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  if (GetRequiredDefinition(std::__cxx11::string_const&)::empty_abi_cxx11_ == '\0') {
    GetRequiredDefinition();
  }
  psVar1 = GetDef(this,name);
  if (psVar1 == (string *)0x0) {
    std::operator+(&local_30,
                   "Error required internal CMake variable not set, cmake may not be built correctly.\nMissing variable is:\n"
                   ,name);
    cmSystemTools::Error(&local_30);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
    psVar1 = &GetRequiredDefinition(std::__cxx11::string_const&)::empty_abi_cxx11_;
  }
  return psVar1;
}

Assistant:

const std::string& cmMakefile::GetRequiredDefinition(
  const std::string& name) const
{
  static std::string const empty;
  const std::string* def = GetDef(name);
  if (!def) {
    cmSystemTools::Error("Error required internal CMake variable not "
                         "set, cmake may not be built correctly.\n"
                         "Missing variable is:\n" +
                         name);
    return empty;
  }
  return *def;
}